

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O3

void __thiscall
spdlog::details::p_formatter<spdlog::details::scoped_padder>::format
          (p_formatter<spdlog::details::scoped_padder> *this,log_msg *param_1,tm *tm_time,
          memory_buf_t *dest)

{
  char *pcVar1;
  char *begin;
  scoped_padder p;
  scoped_padder sStack_38;
  
  scoped_padder::scoped_padder(&sStack_38,2,&(this->super_flag_formatter).padinfo_,dest);
  begin = "AM";
  if (0xb < tm_time->tm_hour) {
    begin = "PM";
  }
  pcVar1 = "AM";
  if (0xb < tm_time->tm_hour) {
    pcVar1 = "PM";
  }
  fmt::v9::detail::buffer<char>::append<char>(&dest->super_buffer<char>,begin,pcVar1 + 2);
  scoped_padder::~scoped_padder(&sStack_38);
  return;
}

Assistant:

void format(const details::log_msg &, const std::tm &tm_time, memory_buf_t &dest) override {
        const size_t field_size = 2;
        ScopedPadder p(field_size, padinfo_, dest);
        fmt_helper::append_string_view(ampm(tm_time), dest);
    }